

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve64_CP32_SHA512.c
# Opt level: O0

uint32_t Hacl_HPKE_Curve64_CP32_SHA512_setupBaseS
                   (uint8_t *o_pkE,Hacl_Impl_HPKE_context_s o_ctx,uint8_t *skE,uint8_t *pkR,
                   uint32_t infolen,uint8_t *info)

{
  long lVar1;
  uint8_t *puVar2;
  undefined8 __src;
  byte bVar3;
  __uint16_t _Var4;
  uint ikmlen;
  uint32_t uVar5;
  uint8_t *puVar6;
  undefined8 uStack_680;
  uint8_t auStack_678 [152];
  undefined8 uStack_5e0;
  uint8_t auStack_5d8 [152];
  undefined8 uStack_540;
  uint8_t auStack_538 [56];
  undefined8 uStack_500;
  uint8_t auStack_4f8 [88];
  undefined8 uStack_4a0;
  uint8_t local_498 [24];
  undefined8 uStack_480;
  uint8_t auStack_478 [24];
  undefined8 uStack_460;
  uint8_t *local_458;
  uint8_t *local_450;
  uint8_t *local_448;
  uint8_t *local_440;
  uint8_t *local_438;
  uint8_t *local_430;
  uint8_t *local_428;
  uint8_t *local_420;
  Hacl_Impl_HPKE_context_s *local_418;
  uint8_t *local_410;
  uint8_t *uu____14;
  unsigned_long __vla_expr7;
  uint32_t len_1;
  uint8_t label_base_nonce [10];
  uint8_t *uu____13;
  unsigned_long __vla_expr6;
  uint32_t len4;
  uint8_t label_key [3];
  uint8_t *uu____12;
  unsigned_long __vla_expr5;
  uint32_t len3;
  uint8_t label_exp [3];
  uint8_t *uu____11;
  unsigned_long __vla_expr4;
  uint32_t len2;
  uint8_t label_secret [6];
  uint8_t *uu____10;
  unsigned_long __vla_expr3;
  uint8_t local_388 [4];
  uint32_t len1;
  uint8_t o_info_hash [64];
  uint8_t label_info_hash [9];
  uint8_t *uu____9;
  unsigned_long __vla_expr2;
  uint32_t len0_1;
  uint8_t *empty_1;
  uint8_t o_psk_id_hash [64];
  uint8_t label_psk_id_hash [11];
  uint8_t *uu____8;
  uint8_t *uu____7;
  uint8_t *uu____6;
  uint8_t *uu____5;
  undefined1 uStack_290;
  undefined1 uStack_28f;
  undefined1 uStack_28e;
  undefined1 uStack_28d;
  undefined1 uStack_28c;
  undefined1 uStack_28b;
  uint8_t suite_id [10];
  uint8_t o_secret [64];
  uint8_t o_context [129];
  uint8_t *uu____4;
  unsigned_long __vla_expr1;
  uint32_t len;
  uint8_t label_shared_secret [13];
  uint8_t *uu____3;
  unsigned_long __vla_expr0;
  uint32_t len0;
  uint8_t label_eae_prk [7];
  uint8_t *empty;
  uint8_t *uu____2;
  uint8_t *uu____1;
  uint8_t local_148 [3];
  uint8_t suite_id_kem [5];
  uint8_t o_eae_prk [32];
  uint8_t *o_dhm;
  uint8_t *o_pkR;
  uint8_t *o_pkRm;
  uint8_t o_kemcontext [64];
  uint32_t res20;
  uint32_t res;
  uint8_t z;
  uint8_t uu____0;
  uint32_t i;
  uint8_t res2;
  uint8_t zeros [32];
  uint8_t o_dh [32];
  uint32_t res0;
  uint32_t res1;
  uint8_t *o_pkE1;
  uint8_t o_shared [32];
  uint8_t *info_local;
  uint32_t infolen_local;
  uint8_t *pkR_local;
  uint8_t *skE_local;
  uint8_t *o_pkE_local;
  
  local_418 = &o_ctx;
  uStack_460 = 0x2a5219;
  o_shared._24_8_ = info;
  memset(&o_pkE1,0,0x20);
  uStack_460 = 0x2a522e;
  Hacl_Curve25519_64_secret_to_public(o_pkE,skE);
  uStack_460 = 0x2a524f;
  memset(zeros + 0x18,0,0x20);
  uStack_460 = 0x2a5262;
  memset(&i,0,0x20);
  uStack_460 = 0x2a5273;
  Hacl_Curve25519_64_scalarmult(zeros + 0x18,skE,pkR);
  uu____0 = 0xff;
  for (res = 0; res < 0x20; res = res + 1) {
    uStack_460 = 0x2a52ad;
    bVar3 = FStar_UInt8_eq_mask(zeros[(ulong)res + 0x18],*(uint8_t *)((long)&i + (ulong)res));
    uu____0 = bVar3 & uu____0;
  }
  o_dh[0x18] = uu____0 == 0xff;
  uStack_460 = 0x2a5329;
  memset(&o_pkRm,0,0x40);
  if (!(bool)o_dh[0x18]) {
    o_pkRm = *(uint8_t **)o_pkE;
    o_kemcontext._0_8_ = *(undefined8 *)(o_pkE + 8);
    o_kemcontext._8_8_ = *(undefined8 *)(o_pkE + 0x10);
    o_kemcontext._16_8_ = *(undefined8 *)(o_pkE + 0x18);
    o_kemcontext._24_8_ = *(undefined8 *)pkR;
    o_kemcontext._32_8_ = *(undefined8 *)(pkR + 8);
    o_kemcontext._40_8_ = *(undefined8 *)(pkR + 0x10);
    o_kemcontext._48_8_ = *(undefined8 *)(pkR + 0x18);
    uStack_460 = 0x2a53cc;
    memset(local_148,0,0x20);
    uStack_460 = 0x2a53df;
    memset((void *)((long)&uu____1 + 3),0,5);
    uu____1._3_1_ = 0x4b;
    uu____1._4_1_ = 0x45;
    uu____1._5_1_ = 0x4d;
    uu____1._6_1_ = 0;
    uu____1._7_1_ = ' ';
    local_420 = local_498;
    uStack_4a0 = 0x2a54e9;
    memset(local_420,0,0x33);
    puVar6 = local_420;
    *local_420 = 'H';
    puVar6[1] = 'P';
    puVar6[2] = 'K';
    puVar6[3] = 'E';
    puVar6[4] = '-';
    puVar6[5] = 'v';
    puVar6[6] = '1';
    *(undefined4 *)(puVar6 + 7) = uu____1._3_4_;
    puVar6[0xb] = uu____1._7_1_;
    puVar6[0xc] = 'e';
    puVar6[0xd] = 'a';
    puVar6[0xe] = 'e';
    puVar6[0xf] = '_';
    puVar6[0x10] = 'p';
    puVar6[0x11] = 'r';
    puVar6[0x12] = 'k';
    *(undefined8 *)(puVar6 + 0x13) = zeros._24_8_;
    *(undefined8 *)(puVar6 + 0x1b) = o_dh._0_8_;
    *(undefined8 *)(puVar6 + 0x23) = o_dh._8_8_;
    *(undefined8 *)(puVar6 + 0x2b) = o_dh._16_8_;
    uStack_4a0 = 0x2a55b4;
    Hacl_HKDF_extract_sha2_256(local_148,(uint8_t *)((long)&uu____1 + 3),0,puVar6,0x33);
    local_428 = auStack_4f8;
    uStack_500 = 0x2a5653;
    memset(local_428,0,0x5b);
    uStack_500 = 0x2a565d;
    _Var4 = __bswap_16(0x20);
    uStack_500 = 0x2a566c;
    store16(local_428,_Var4);
    puVar6 = local_428;
    local_428[2] = 'H';
    puVar6[3] = 'P';
    puVar6[4] = 'K';
    puVar6[5] = 'E';
    puVar6[6] = '-';
    puVar6[7] = 'v';
    puVar6[8] = '1';
    *(undefined4 *)(puVar6 + 9) = uu____1._3_4_;
    puVar6[0xd] = uu____1._7_1_;
    puVar6[0xe] = 's';
    puVar6[0xf] = 'h';
    puVar6[0x10] = 'a';
    puVar6[0x11] = 'r';
    puVar6[0x12] = 'e';
    puVar6[0x13] = 'd';
    puVar6[0x14] = '_';
    puVar6[0x15] = 's';
    puVar6[0x16] = 'e';
    puVar6[0x17] = 'c';
    puVar6[0x18] = 'r';
    puVar6[0x19] = 'e';
    puVar6[0x1a] = 't';
    uStack_500 = 0x2a5711;
    memcpy(puVar6 + 0x1b,&o_pkRm,0x40);
    uStack_500 = 0x2a5738;
    Hacl_HKDF_expand_sha2_256((uint8_t *)&o_pkE1,local_148,0x20,local_428,0x5b,0x20);
  }
  o_dh[0x19] = '\0';
  o_dh[0x1a] = '\0';
  o_dh[0x1b] = '\0';
  if (o_dh._24_4_ == 0) {
    uStack_460 = 0x2a5778;
    memset(o_secret + 0x38,0,0x81);
    uStack_460 = 0x2a578b;
    memset(suite_id + 2,0,0x40);
    uStack_460 = 0x2a579e;
    memset((void *)((long)&uu____5 + 6),0,10);
    uu____5._6_1_ = 0x48;
    uu____5._7_1_ = 0x50;
    uStack_290 = 0x4b;
    uStack_28f = 0x45;
    uStack_28e = 0;
    uStack_28d = 0x20;
    uStack_28c = 0;
    uStack_28b = 3;
    suite_id[0] = '\0';
    suite_id[1] = '\x03';
    stack0xfffffffffffffd3d = 0x685f64695f6b7370;
    uStack_460 = 0x2a5887;
    memset(&empty_1,0,0x40);
    uStack_480 = 0x2a5916;
    local_430 = auStack_478;
    memset(auStack_478,0,0x1c);
    puVar6 = local_430;
    *local_430 = 'H';
    puVar6[1] = 'P';
    puVar6[2] = 'K';
    puVar6[3] = 'E';
    puVar6[4] = '-';
    puVar6[5] = 'v';
    puVar6[6] = '1';
    *(undefined8 *)(puVar6 + 7) = stack0xfffffffffffffd6e;
    *(undefined2 *)(puVar6 + 0xf) = suite_id._0_2_;
    *(undefined8 *)(puVar6 + 0x11) = stack0xfffffffffffffd3d;
    puVar6[0x19] = 'a';
    puVar6[0x1a] = 's';
    puVar6[0x1b] = 'h';
    uStack_480 = 0x2a59c8;
    Hacl_HKDF_extract_sha2_512((uint8_t *)&empty_1,(uint8_t *)((long)&uu____5 + 6),0,puVar6,0x1c);
    uStack_480 = 0x2a59f5;
    memset(local_388,0,0x40);
    ikmlen = infolen + 0x1a;
    lVar1 = -((ulong)ikmlen + 0xf & 0xfffffffffffffff0);
    puVar6 = auStack_478 + lVar1;
    local_438 = puVar6;
    *(undefined8 *)((long)&uStack_480 + lVar1) = 0x2a5a70;
    memset(puVar6,0,(ulong)ikmlen);
    puVar6 = local_438;
    *local_438 = 'H';
    puVar6[1] = 'P';
    puVar6[2] = 'K';
    puVar6[3] = 'E';
    puVar6[4] = '-';
    puVar6[5] = 'v';
    puVar6[6] = '1';
    *(undefined8 *)(puVar6 + 7) = stack0xfffffffffffffd6e;
    *(undefined2 *)(puVar6 + 0xf) = suite_id._0_2_;
    puVar6[0x11] = 'i';
    puVar6[0x12] = 'n';
    puVar6[0x13] = 'f';
    puVar6[0x14] = 'o';
    puVar6[0x15] = '_';
    puVar6[0x16] = 'h';
    puVar6[0x17] = 'a';
    puVar6[0x18] = 's';
    puVar6[0x19] = 'h';
    __src = o_shared._24_8_;
    *(undefined8 *)((long)&uStack_480 + lVar1) = 0x2a5b0a;
    memcpy(puVar6 + 0x1a,(void *)__src,(ulong)infolen);
    puVar6 = local_438;
    *(undefined8 *)((long)&uStack_480 + lVar1) = 0x2a5b2d;
    Hacl_HKDF_extract_sha2_512(local_388,(uint8_t *)((long)&uu____5 + 6),0,puVar6,ikmlen);
    o_secret[0x38] = '\0';
    *(undefined8 *)((long)&uStack_480 + lVar1) = 0x2a5b50;
    memcpy(o_secret + 0x39,&empty_1,0x40);
    *(undefined8 *)((long)&uStack_480 + lVar1) = 0x2a5b6c;
    memcpy(o_context + 0x39,local_388,0x40);
    local_440 = local_498 + lVar1;
    *(undefined8 *)((long)&uStack_4a0 + lVar1) = 0x2a5bff;
    memset(local_498 + lVar1,0,0x17);
    puVar6 = local_440;
    *local_440 = 'H';
    puVar6[1] = 'P';
    puVar6[2] = 'K';
    puVar6[3] = 'E';
    puVar6[4] = '-';
    puVar6[5] = 'v';
    puVar6[6] = '1';
    *(undefined8 *)(puVar6 + 7) = stack0xfffffffffffffd6e;
    *(undefined2 *)(puVar6 + 0xf) = suite_id._0_2_;
    puVar6[0x11] = 's';
    puVar6[0x12] = 'e';
    puVar6[0x13] = 'c';
    puVar6[0x14] = 'r';
    puVar6[0x15] = 'e';
    puVar6[0x16] = 't';
    *(undefined8 *)((long)&uStack_4a0 + lVar1) = 0x2a5ca6;
    Hacl_HKDF_extract_sha2_512(suite_id + 2,(uint8_t *)&o_pkE1,0x20,puVar6,0x17);
    local_448 = auStack_538 + lVar1;
    *(undefined8 *)((long)&uStack_540 + lVar1) = 0x2a5d39;
    memset(auStack_538 + lVar1,0,0x97);
    *(undefined8 *)((long)&uStack_540 + lVar1) = 0x2a5d43;
    _Var4 = __bswap_16(0x40);
    puVar6 = local_448;
    *(undefined8 *)((long)&uStack_540 + lVar1) = 0x2a5d52;
    store16(puVar6,_Var4);
    puVar6 = local_448;
    local_448[2] = 'H';
    puVar6[3] = 'P';
    puVar6[4] = 'K';
    puVar6[5] = 'E';
    puVar6[6] = '-';
    puVar6[7] = 'v';
    puVar6[8] = '1';
    *(undefined8 *)(puVar6 + 9) = stack0xfffffffffffffd6e;
    *(undefined2 *)(puVar6 + 0x11) = suite_id._0_2_;
    puVar6[0x13] = 'e';
    puVar6[0x14] = 'x';
    puVar6[0x15] = 'p';
    *(undefined8 *)((long)&uStack_540 + lVar1) = 0x2a5df2;
    memcpy(puVar6 + 0x16,o_secret + 0x38,0x81);
    puVar2 = local_448;
    puVar6 = local_418->ctx_exporter;
    *(undefined8 *)((long)&uStack_540 + lVar1) = 0x2a5e20;
    Hacl_HKDF_expand_sha2_512(puVar6,suite_id + 2,0x40,puVar2,0x97,0x40);
    local_450 = auStack_5d8 + lVar1;
    *(undefined8 *)((long)&uStack_5e0 + lVar1) = 0x2a5eb3;
    memset(auStack_5d8 + lVar1,0,0x97);
    *(undefined8 *)((long)&uStack_5e0 + lVar1) = 0x2a5ebd;
    _Var4 = __bswap_16(0x20);
    puVar6 = local_450;
    *(undefined8 *)((long)&uStack_5e0 + lVar1) = 0x2a5ecc;
    store16(puVar6,_Var4);
    puVar6 = local_450;
    label_base_nonce._2_8_ = local_450 + 2;
    *(uint8_t *)label_base_nonce._2_8_ = 'H';
    *(undefined1 *)(label_base_nonce._2_8_ + 1) = 0x50;
    *(undefined1 *)(label_base_nonce._2_8_ + 2) = 0x4b;
    *(undefined1 *)(label_base_nonce._2_8_ + 3) = 0x45;
    *(undefined1 *)(label_base_nonce._2_8_ + 4) = 0x2d;
    *(undefined1 *)(label_base_nonce._2_8_ + 5) = 0x76;
    *(undefined1 *)(label_base_nonce._2_8_ + 6) = 0x31;
    *(undefined8 *)(puVar6 + 9) = stack0xfffffffffffffd6e;
    *(undefined2 *)(puVar6 + 0x11) = suite_id._0_2_;
    puVar6[0x13] = 'k';
    puVar6[0x14] = 'e';
    puVar6[0x15] = 'y';
    *(undefined8 *)((long)&uStack_5e0 + lVar1) = 0x2a5f6c;
    memcpy(puVar6 + 0x16,o_secret + 0x38,0x81);
    puVar2 = local_450;
    puVar6 = local_418->ctx_key;
    *(undefined8 *)((long)&uStack_5e0 + lVar1) = 0x2a5f9b;
    Hacl_HKDF_expand_sha2_512(puVar6,suite_id + 2,0x40,puVar2,0x97,0x20);
    stack0xfffffffffffffc06 = 0x6e6f6e5f65736162;
    label_base_nonce[0] = 'c';
    label_base_nonce[1] = 'e';
    __vla_expr7._0_4_ = 0x9e;
    uu____14 = (uint8_t *)0x9e;
    local_458 = auStack_678 + lVar1;
    *(undefined8 *)((long)&uStack_680 + lVar1) = 0x2a6030;
    memset(auStack_678 + lVar1,0,0x9e);
    *(undefined8 *)((long)&uStack_680 + lVar1) = 0x2a603a;
    _Var4 = __bswap_16(0xc);
    puVar6 = local_458;
    *(undefined8 *)((long)&uStack_680 + lVar1) = 0x2a6049;
    store16(puVar6,_Var4);
    local_410 = local_458 + 2;
    *local_410 = 'H';
    local_410[1] = 'P';
    local_410[2] = 'K';
    local_410[3] = 'E';
    local_410[4] = '-';
    local_410[5] = 'v';
    local_410[6] = '1';
    *(undefined8 *)(local_458 + 9) = stack0xfffffffffffffd6e;
    *(undefined2 *)(local_458 + 0x11) = suite_id._0_2_;
    *(undefined8 *)(local_458 + 0x13) = stack0xfffffffffffffc06;
    *(undefined2 *)(local_458 + 0x1b) = label_base_nonce._0_2_;
    puVar6 = local_458 + 0x1d;
    *(undefined8 *)((long)&uStack_680 + lVar1) = 0x2a60eb;
    memcpy(puVar6,o_secret + 0x38,0x81);
    uVar5 = (uint32_t)__vla_expr7;
    puVar2 = local_458;
    puVar6 = local_418->ctx_nonce;
    *(undefined8 *)((long)&uStack_680 + lVar1) = 0x2a611b;
    Hacl_HKDF_expand_sha2_512(puVar6,suite_id + 2,0x40,puVar2,uVar5,0xc);
    *local_418->ctx_seq = 0;
  }
  uVar5._0_1_ = o_dh[0x18];
  uVar5._1_1_ = '\0';
  uVar5._2_1_ = '\0';
  uVar5._3_1_ = '\0';
  return uVar5;
}

Assistant:

uint32_t
Hacl_HPKE_Curve64_CP32_SHA512_setupBaseS(
  uint8_t *o_pkE,
  Hacl_Impl_HPKE_context_s o_ctx,
  uint8_t *skE,
  uint8_t *pkR,
  uint32_t infolen,
  uint8_t *info
)
{
  uint8_t o_shared[32U] = { 0U };
  uint8_t *o_pkE1 = o_pkE;
  Hacl_Curve25519_64_secret_to_public(o_pkE1, skE);
  uint32_t res1 = 0U;
  uint32_t res0;
  if (res1 == 0U)
  {
    uint8_t o_dh[32U] = { 0U };
    uint8_t zeros[32U] = { 0U };
    Hacl_Curve25519_64_scalarmult(o_dh, skE, pkR);
    uint8_t res2 = 255U;
    for (uint32_t i = 0U; i < 32U; i++)
    {
      uint8_t uu____0 = FStar_UInt8_eq_mask(o_dh[i], zeros[i]);
      res2 = (uint32_t)uu____0 & (uint32_t)res2;
    }
    uint8_t z = res2;
    uint32_t res;
    if (z == 255U)
    {
      res = 1U;
    }
    else
    {
      res = 0U;
    }
    uint32_t res20 = res;
    uint8_t o_kemcontext[64U] = { 0U };
    if (res20 == 0U)
    {
      memcpy(o_kemcontext, o_pkE, 32U * sizeof (uint8_t));
      uint8_t *o_pkRm = o_kemcontext + 32U;
      uint8_t *o_pkR = o_pkRm;
      memcpy(o_pkR, pkR, 32U * sizeof (uint8_t));
      uint8_t *o_dhm = o_dh;
      uint8_t o_eae_prk[32U] = { 0U };
      uint8_t suite_id_kem[5U] = { 0U };
      uint8_t *uu____1 = suite_id_kem;
      uu____1[0U] = 0x4bU;
      uu____1[1U] = 0x45U;
      uu____1[2U] = 0x4dU;
      uint8_t *uu____2 = suite_id_kem + 3U;
      uu____2[0U] = 0U;
      uu____2[1U] = 32U;
      uint8_t *empty = suite_id_kem;
      uint8_t label_eae_prk[7U] = { 0x65U, 0x61U, 0x65U, 0x5fU, 0x70U, 0x72U, 0x6bU };
      uint32_t len0 = 51U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len0);
      uint8_t tmp0[len0];
      memset(tmp0, 0U, len0 * sizeof (uint8_t));
      uint8_t *uu____3 = tmp0;
      uu____3[0U] = 0x48U;
      uu____3[1U] = 0x50U;
      uu____3[2U] = 0x4bU;
      uu____3[3U] = 0x45U;
      uu____3[4U] = 0x2dU;
      uu____3[5U] = 0x76U;
      uu____3[6U] = 0x31U;
      memcpy(tmp0 + 7U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp0 + 12U, label_eae_prk, 7U * sizeof (uint8_t));
      memcpy(tmp0 + 19U, o_dhm, 32U * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_eae_prk, empty, 0U, tmp0, len0);
      uint8_t
      label_shared_secret[13U] =
        {
          0x73U, 0x68U, 0x61U, 0x72U, 0x65U, 0x64U, 0x5fU, 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U
        };
      uint32_t len = 91U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len);
      uint8_t tmp[len];
      memset(tmp, 0U, len * sizeof (uint8_t));
      store16_be(tmp, (uint16_t)32U);
      uint8_t *uu____4 = tmp + 2U;
      uu____4[0U] = 0x48U;
      uu____4[1U] = 0x50U;
      uu____4[2U] = 0x4bU;
      uu____4[3U] = 0x45U;
      uu____4[4U] = 0x2dU;
      uu____4[5U] = 0x76U;
      uu____4[6U] = 0x31U;
      memcpy(tmp + 9U, suite_id_kem, 5U * sizeof (uint8_t));
      memcpy(tmp + 14U, label_shared_secret, 13U * sizeof (uint8_t));
      memcpy(tmp + 27U, o_kemcontext, 64U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_shared, o_eae_prk, 32U, tmp, len, 32U);
      res0 = 0U;
    }
    else
    {
      res0 = 1U;
    }
  }
  else
  {
    res0 = 1U;
  }
  if (res0 == 0U)
  {
    uint8_t o_context[129U] = { 0U };
    uint8_t o_secret[64U] = { 0U };
    uint8_t suite_id[10U] = { 0U };
    uint8_t *uu____5 = suite_id;
    uu____5[0U] = 0x48U;
    uu____5[1U] = 0x50U;
    uu____5[2U] = 0x4bU;
    uu____5[3U] = 0x45U;
    uint8_t *uu____6 = suite_id + 4U;
    uu____6[0U] = 0U;
    uu____6[1U] = 32U;
    uint8_t *uu____7 = suite_id + 6U;
    uu____7[0U] = 0U;
    uu____7[1U] = 3U;
    uint8_t *uu____8 = suite_id + 8U;
    uu____8[0U] = 0U;
    uu____8[1U] = 3U;
    uint8_t
    label_psk_id_hash[11U] =
      { 0x70U, 0x73U, 0x6bU, 0x5fU, 0x69U, 0x64U, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_psk_id_hash[64U] = { 0U };
    uint8_t *empty = suite_id;
    uint32_t len0 = 28U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len0);
    uint8_t tmp0[len0];
    memset(tmp0, 0U, len0 * sizeof (uint8_t));
    uint8_t *uu____9 = tmp0;
    uu____9[0U] = 0x48U;
    uu____9[1U] = 0x50U;
    uu____9[2U] = 0x4bU;
    uu____9[3U] = 0x45U;
    uu____9[4U] = 0x2dU;
    uu____9[5U] = 0x76U;
    uu____9[6U] = 0x31U;
    memcpy(tmp0 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp0 + 17U, label_psk_id_hash, 11U * sizeof (uint8_t));
    memcpy(tmp0 + 28U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_psk_id_hash, empty, 0U, tmp0, len0);
    uint8_t
    label_info_hash[9U] = { 0x69U, 0x6eU, 0x66U, 0x6fU, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
    uint8_t o_info_hash[64U] = { 0U };
    uint32_t len1 = 26U + infolen;
    KRML_CHECK_SIZE(sizeof (uint8_t), len1);
    uint8_t tmp1[len1];
    memset(tmp1, 0U, len1 * sizeof (uint8_t));
    uint8_t *uu____10 = tmp1;
    uu____10[0U] = 0x48U;
    uu____10[1U] = 0x50U;
    uu____10[2U] = 0x4bU;
    uu____10[3U] = 0x45U;
    uu____10[4U] = 0x2dU;
    uu____10[5U] = 0x76U;
    uu____10[6U] = 0x31U;
    memcpy(tmp1 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp1 + 17U, label_info_hash, 9U * sizeof (uint8_t));
    memcpy(tmp1 + 26U, info, infolen * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_info_hash, empty, 0U, tmp1, len1);
    o_context[0U] = 0U;
    memcpy(o_context + 1U, o_psk_id_hash, 64U * sizeof (uint8_t));
    memcpy(o_context + 65U, o_info_hash, 64U * sizeof (uint8_t));
    uint8_t label_secret[6U] = { 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U };
    uint32_t len2 = 23U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len2);
    uint8_t tmp2[len2];
    memset(tmp2, 0U, len2 * sizeof (uint8_t));
    uint8_t *uu____11 = tmp2;
    uu____11[0U] = 0x48U;
    uu____11[1U] = 0x50U;
    uu____11[2U] = 0x4bU;
    uu____11[3U] = 0x45U;
    uu____11[4U] = 0x2dU;
    uu____11[5U] = 0x76U;
    uu____11[6U] = 0x31U;
    memcpy(tmp2 + 7U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp2 + 17U, label_secret, 6U * sizeof (uint8_t));
    memcpy(tmp2 + 23U, empty, 0U * sizeof (uint8_t));
    Hacl_HKDF_extract_sha2_512(o_secret, o_shared, 32U, tmp2, len2);
    uint8_t label_exp[3U] = { 0x65U, 0x78U, 0x70U };
    uint32_t len3 = 151U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len3);
    uint8_t tmp3[len3];
    memset(tmp3, 0U, len3 * sizeof (uint8_t));
    store16_be(tmp3, (uint16_t)64U);
    uint8_t *uu____12 = tmp3 + 2U;
    uu____12[0U] = 0x48U;
    uu____12[1U] = 0x50U;
    uu____12[2U] = 0x4bU;
    uu____12[3U] = 0x45U;
    uu____12[4U] = 0x2dU;
    uu____12[5U] = 0x76U;
    uu____12[6U] = 0x31U;
    memcpy(tmp3 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp3 + 19U, label_exp, 3U * sizeof (uint8_t));
    memcpy(tmp3 + 22U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_exporter, o_secret, 64U, tmp3, len3, 64U);
    uint8_t label_key[3U] = { 0x6bU, 0x65U, 0x79U };
    uint32_t len4 = 151U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len4);
    uint8_t tmp4[len4];
    memset(tmp4, 0U, len4 * sizeof (uint8_t));
    store16_be(tmp4, (uint16_t)32U);
    uint8_t *uu____13 = tmp4 + 2U;
    uu____13[0U] = 0x48U;
    uu____13[1U] = 0x50U;
    uu____13[2U] = 0x4bU;
    uu____13[3U] = 0x45U;
    uu____13[4U] = 0x2dU;
    uu____13[5U] = 0x76U;
    uu____13[6U] = 0x31U;
    memcpy(tmp4 + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp4 + 19U, label_key, 3U * sizeof (uint8_t));
    memcpy(tmp4 + 22U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_key, o_secret, 64U, tmp4, len4, 32U);
    uint8_t
    label_base_nonce[10U] =
      { 0x62U, 0x61U, 0x73U, 0x65U, 0x5fU, 0x6eU, 0x6fU, 0x6eU, 0x63U, 0x65U };
    uint32_t len = 158U;
    KRML_CHECK_SIZE(sizeof (uint8_t), len);
    uint8_t tmp[len];
    memset(tmp, 0U, len * sizeof (uint8_t));
    store16_be(tmp, (uint16_t)12U);
    uint8_t *uu____14 = tmp + 2U;
    uu____14[0U] = 0x48U;
    uu____14[1U] = 0x50U;
    uu____14[2U] = 0x4bU;
    uu____14[3U] = 0x45U;
    uu____14[4U] = 0x2dU;
    uu____14[5U] = 0x76U;
    uu____14[6U] = 0x31U;
    memcpy(tmp + 9U, suite_id, 10U * sizeof (uint8_t));
    memcpy(tmp + 19U, label_base_nonce, 10U * sizeof (uint8_t));
    memcpy(tmp + 29U, o_context, 129U * sizeof (uint8_t));
    Hacl_HKDF_expand_sha2_512(o_ctx.ctx_nonce, o_secret, 64U, tmp, len, 12U);
    o_ctx.ctx_seq[0U] = 0ULL;
    return res0;
  }
  return res0;
}